

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

GetMnemonicWordlistResponseStruct *
cfd::js::api::HDWalletStructApi::GetMnemonicWordlist
          (GetMnemonicWordlistResponseStruct *__return_storage_ptr__,
          GetMnemonicWordlistRequestStruct *request)

{
  GetMnemonicWordlistRequestStruct *this;
  string *in_R8;
  allocator local_121;
  function<cfd::js::api::GetMnemonicWordlistResponseStruct_(const_cfd::js::api::GetMnemonicWordlistRequestStruct_&)>
  local_120;
  undefined1 local_100 [230];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetMnemonicWordlistRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetMnemonicWordlistRequestStruct *request_local;
  GetMnemonicWordlistResponseStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  GetMnemonicWordlistResponseStruct::GetMnemonicWordlistResponseStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::
  function<cfd::js::api::GetMnemonicWordlistResponseStruct(cfd::js::api::GetMnemonicWordlistRequestStruct_const&)>
  ::
  function<cfd::js::api::HDWalletStructApi::GetMnemonicWordlist(cfd::js::api::GetMnemonicWordlistRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::GetMnemonicWordlistResponseStruct(cfd::js::api::GetMnemonicWordlistRequestStruct_const&)>
              *)local_100,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"GetMnemonicWordlist",&local_121);
  ExecuteStructApi<cfd::js::api::GetMnemonicWordlistRequestStruct,cfd::js::api::GetMnemonicWordlistResponseStruct>
            ((GetMnemonicWordlistResponseStruct *)(local_100 + 0x20),(api *)this,
             (GetMnemonicWordlistRequestStruct *)local_100,&local_120,in_R8);
  GetMnemonicWordlistResponseStruct::operator=
            (__return_storage_ptr__,(GetMnemonicWordlistResponseStruct *)(local_100 + 0x20));
  GetMnemonicWordlistResponseStruct::~GetMnemonicWordlistResponseStruct
            ((GetMnemonicWordlistResponseStruct *)(local_100 + 0x20));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::
  function<cfd::js::api::GetMnemonicWordlistResponseStruct_(const_cfd::js::api::GetMnemonicWordlistRequestStruct_&)>
  ::~function((function<cfd::js::api::GetMnemonicWordlistResponseStruct_(const_cfd::js::api::GetMnemonicWordlistRequestStruct_&)>
               *)local_100);
  return __return_storage_ptr__;
}

Assistant:

GetMnemonicWordlistResponseStruct HDWalletStructApi::GetMnemonicWordlist(
    const GetMnemonicWordlistRequestStruct& request) {
  auto call_func = [](const GetMnemonicWordlistRequestStruct& request)
      -> GetMnemonicWordlistResponseStruct {
    GetMnemonicWordlistResponseStruct response;
    // check language is support
    std::string language = request.language;

    // get bip39 wordlist
    HDWalletApi api;
    std::vector<std::string> wordlist = api.GetMnemonicWordlist(language);

    response.wordlist = wordlist;
    return response;
  };

  GetMnemonicWordlistResponseStruct result;
  result = ExecuteStructApi<
      GetMnemonicWordlistRequestStruct, GetMnemonicWordlistResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}